

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::UdpPortListSyntax::isKind(SyntaxKind kind)

{
  bool local_9;
  SyntaxKind kind_local;
  
  if (((kind == AnsiUdpPortList) || (kind == NonAnsiUdpPortList)) || (kind == WildcardUdpPortList))
  {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool UdpPortListSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AnsiUdpPortList:
        case SyntaxKind::NonAnsiUdpPortList:
        case SyntaxKind::WildcardUdpPortList:
            return true;
        default:
            return false;
    }
}